

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

void __thiscall
argparse::ArgumentParser::ArgumentParser
          (ArgumentParser *this,string *program_name,string *version,default_arguments add_args,
          bool exit_on_default_arguments,ostream *os)

{
  _Rb_tree_header *p_Var1;
  Argument *pAVar2;
  allocator<char> local_ca;
  bool local_c9;
  string *local_c8;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *local_c0;
  string *local_b8;
  string *local_b0;
  string *local_a8;
  anon_class_16_2_e880815f local_a0;
  any local_90;
  any local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string(&this->m_program_name,program_name);
  local_a8 = &this->m_version;
  std::__cxx11::string::string(local_a8,version);
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  (this->m_description)._M_string_length = 0;
  (this->m_description).field_2._M_local_buf[0] = '\0';
  (this->m_epilog)._M_dataplus._M_p = (pointer)&(this->m_epilog).field_2;
  (this->m_epilog)._M_string_length = 0;
  (this->m_epilog).field_2._M_local_buf[0] = '\0';
  this->m_exit_on_default_arguments = exit_on_default_arguments;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_prefix_chars,"-",(allocator<char> *)&local_a0);
  local_b8 = &this->m_assign_chars;
  local_b0 = &this->m_prefix_chars;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"=",(allocator<char> *)&local_a0);
  this->m_is_parsed = false;
  local_c0 = &this->m_positional_arguments;
  (this->m_positional_arguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)local_c0;
  (this->m_positional_arguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)local_c0;
  (this->m_positional_arguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node._M_size
       = 0;
  (this->m_optional_arguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->m_optional_arguments;
  (this->m_optional_arguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->m_optional_arguments;
  (this->m_optional_arguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node._M_size
       = 0;
  (this->m_argument_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_argument_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_argument_map)._M_t._M_impl.super__Rb_tree_header;
  (this->m_argument_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_argument_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_argument_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8 = &this->m_parser_path;
  std::__cxx11::string::string((string *)local_c8,&this->m_program_name);
  (this->m_subparsers).
  super__List_base<std::reference_wrapper<argparse::ArgumentParser>,_std::allocator<std::reference_wrapper<argparse::ArgumentParser>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_subparsers;
  (this->m_subparsers).
  super__List_base<std::reference_wrapper<argparse::ArgumentParser>,_std::allocator<std::reference_wrapper<argparse::ArgumentParser>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_subparsers;
  (this->m_subparsers).
  super__List_base<std::reference_wrapper<argparse::ArgumentParser>,_std::allocator<std::reference_wrapper<argparse::ArgumentParser>_>_>
  ._M_impl._M_node._M_size = 0;
  p_Var1 = &(this->m_subparser_map)._M_t._M_impl.super__Rb_tree_header;
  (this->m_subparser_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_subparser_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_subparser_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_subparser_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_subparser_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_subparser_used)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_subparser_used)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_subparser_used)._M_t._M_impl.super__Rb_tree_header;
  (this->m_subparser_used)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_subparser_used)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_subparser_used)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_mutually_exclusive_groups).
  super__Vector_base<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_mutually_exclusive_groups).
  super__Vector_base<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_mutually_exclusive_groups).
  super__Vector_base<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_suppress = false;
  if ((add_args & help) != none) {
    pAVar2 = add_argument<char_const*,char_const*>(this,"-h","--help");
    local_a0.this = this;
    local_a0.os = os;
    std::
    variant<std::function<std::any(std::__cxx11::string_const&)>,std::function<void(std::__cxx11::string_const&)>>
    ::
    emplace<1ul,argparse::ArgumentParser::ArgumentParser(std::__cxx11::string,std::__cxx11::string,argparse::default_arguments,bool,std::ostream&)::_lambda(auto:1_const&)_1_>
              ((variant<std::function<std::any(std::__cxx11::string_const&)>,std::function<void(std::__cxx11::string_const&)>>
                *)&pAVar2->m_action,&local_a0);
    local_c9 = false;
    pAVar2 = Argument::default_value<bool>(pAVar2,&local_c9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"shows help message and exits",&local_ca);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&pAVar2->m_help,&local_50);
    local_80._M_manager = std::any::_Manager_internal<bool>::_S_manage;
    local_80._M_storage = (_Storage)0x1;
    pAVar2 = Argument::implicit_value(pAVar2,&local_80);
    Argument::nargs(pAVar2,0);
    std::any::reset(&local_80);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((add_args & version) != none) {
    pAVar2 = add_argument<char_const*,char_const*>(this,"-v","--version");
    local_a0.this = this;
    local_a0.os = os;
    std::
    variant<std::function<std::any(std::__cxx11::string_const&)>,std::function<void(std::__cxx11::string_const&)>>
    ::
    emplace<1ul,argparse::ArgumentParser::ArgumentParser(std::__cxx11::string,std::__cxx11::string,argparse::default_arguments,bool,std::ostream&)::_lambda(auto:1_const&)_2_>
              ((variant<std::function<std::any(std::__cxx11::string_const&)>,std::function<void(std::__cxx11::string_const&)>>
                *)&pAVar2->m_action,&local_a0);
    local_c9 = false;
    pAVar2 = Argument::default_value<bool>(pAVar2,&local_c9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"prints version information and exits",&local_ca);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&pAVar2->m_help,&local_70);
    local_90._M_manager = std::any::_Manager_internal<bool>::_S_manage;
    local_90._M_storage = (_Storage)0x1;
    pAVar2 = Argument::implicit_value(pAVar2,&local_90);
    Argument::nargs(pAVar2,0);
    std::any::reset(&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

explicit ArgumentParser(std::string program_name = {},
                          std::string version = "1.0",
                          default_arguments add_args = default_arguments::all,
                          bool exit_on_default_arguments = true,
                          std::ostream &os = std::cout)
      : m_program_name(std::move(program_name)), m_version(std::move(version)),
        m_exit_on_default_arguments(exit_on_default_arguments),
        m_parser_path(m_program_name) {
    if ((add_args & default_arguments::help) == default_arguments::help) {
      add_argument("-h", "--help")
          .action([&](const auto & /*unused*/) {
            os << help().str();
            if (m_exit_on_default_arguments) {
              std::exit(0);
            }
          })
          .default_value(false)
          .help("shows help message and exits")
          .implicit_value(true)
          .nargs(0);
    }
    if ((add_args & default_arguments::version) == default_arguments::version) {
      add_argument("-v", "--version")
          .action([&](const auto & /*unused*/) {
            os << m_version << std::endl;
            if (m_exit_on_default_arguments) {
              std::exit(0);
            }
          })
          .default_value(false)
          .help("prints version information and exits")
          .implicit_value(true)
          .nargs(0);
    }
  }